

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void __thiscall mjs::array_literal_expression::print(array_literal_expression *this,wostream *os)

{
  __uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_> _Var1;
  pointer puVar2;
  size_t i;
  ulong uVar3;
  
  std::operator<<(os,"array_literal_expression{");
  for (uVar3 = 0;
      puVar2 = (this->elements_).
               super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->elements_).
                            super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3);
      uVar3 = uVar3 + 1) {
    if (uVar3 != 0) {
      std::operator<<(os,", ");
      puVar2 = (this->elements_).
               super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    _Var1._M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
    super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl =
         puVar2[uVar3]._M_t.
         super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t;
    if ((_Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>)
        _Var1._M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
        super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl != (expression *)0x0) {
      (**(code **)(*(long *)_Var1._M_t.
                            super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>
                            .super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl + 0x10))
                (_Var1._M_t.
                 super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
                 super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl,os);
    }
  }
  std::operator<<(os,"}");
  return;
}

Assistant:

void print(std::wostream& os) const override {
        os << "array_literal_expression{";
        for (size_t i = 0; i < elements_.size(); ++i) {
            if (i) os << ", ";
            if (elements_[i]) os << *elements_[i];
        }
        os << "}";
    }